

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64AddressingModes.h
# Opt level: O2

uint64_t AArch64_AM_decodeLogicalImmediate(uint64_t val,uint regSize)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  uint count;
  int iVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  uVar6 = (uint)(val >> 6);
  uVar5 = (uint)val & 0x3f;
  iVar4 = 0;
  for (uVar2 = (uVar6 & 0x40 | uVar5) ^ 0x3f; (iVar4 != 0x1f && (-1 < (int)uVar2));
      uVar2 = uVar2 * 2) {
    iVar4 = iVar4 + 1;
  }
  uVar2 = 0x80000000 >> ((byte)iVar4 & 0x1f);
  uVar6 = uVar6 & 0x3ffffff & uVar2 - 1 & 0x3f;
  bVar1 = (byte)(uVar2 - 1);
  uVar3 = ~(-1L << (((byte)uVar5 & bVar1) + 1 & 0x3f));
  while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
    uVar3 = uVar3 >> 1 | (ulong)((uint)uVar3 & 1) << (bVar1 & 0x3f);
  }
  for (; uVar2 != regSize; uVar2 = uVar2 * 2) {
    uVar3 = uVar3 | uVar3 << ((byte)uVar2 & 0x3f);
  }
  return uVar3;
}

Assistant:

static inline uint64_t AArch64_AM_decodeLogicalImmediate(uint64_t val, unsigned regSize)
{
	// Extract the N, imms, and immr fields.
	unsigned N = (val >> 12) & 1;
	unsigned immr = (val >> 6) & 0x3f;
	unsigned imms = val & 0x3f;
	unsigned i;

	// assert((regSize == 64 || N == 0) && "undefined logical immediate encoding");
	int len = 31 - countLeadingZeros((N << 6) | (~imms & 0x3f));
	// assert(len >= 0 && "undefined logical immediate encoding");
	unsigned size = (1 << len);
	unsigned R = immr & (size - 1);
	unsigned S = imms & (size - 1);
	// assert(S != size - 1 && "undefined logical immediate encoding");
	uint64_t pattern = (1ULL << (S + 1)) - 1;
	for (i = 0; i < R; ++i)
		pattern = ror(pattern, size);

	// Replicate the pattern to fill the regSize.
	while (size != regSize) {
		pattern |= (pattern << size);
		size *= 2;
	}

	return pattern;
}